

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp:278:56)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_object_object_cpp:278:56)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap_ptr_untyped *this_00;
  gc_heap_ptr_untyped gStack_88;
  undefined1 local_78 [32];
  gc_heap_ptr_untyped local_58;
  gc_heap_ptr_untyped local_48;
  string_view local_38;
  string_view local_28;
  
  local_28._M_len = 8;
  local_28._M_str = "[object ";
  string::string((string *)(local_78 + 0x10),(this->f).h,&local_28);
  this_00 = &value::object_value(this_)->super_gc_heap_ptr_untyped;
  gc_heap_ptr_untyped::get(this_00);
  object::class_name((object *)local_78);
  operator+((mjs *)&local_58,(string *)(local_78 + 0x10),(string *)local_78);
  local_38._M_len = 1;
  local_38._M_str = "]";
  string::string((string *)&gStack_88,(this->f).h,&local_38);
  operator+((mjs *)&local_48,(string *)&local_58,(string *)&gStack_88);
  value::value(__return_storage_ptr__,(string *)&local_48);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_48);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_88);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_58);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_78);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_78 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }